

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall
CVmImageLoader::load_mres(CVmImageLoader *this,ulong siz,CVmImageLoaderMres *res_ifc)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong read_len;
  uint uVar7;
  ulong siz_local;
  char buf [16];
  char name_buf [256];
  
  siz_local = siz;
  iVar4 = (*this->fp_->_vptr_CVmImageFile[8])();
  lVar1 = this->base_seek_ofs_;
  read_data(this,buf,2,&siz_local);
  uVar5 = buf._0_4_ & 0xffff;
  for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    read_data(this,buf,9,&siz_local);
    uVar3 = buf._4_4_;
    uVar2 = buf._0_4_;
    read_len = (ulong)(byte)buf[8];
    read_data(this,name_buf,read_len,&siz_local);
    name_buf[read_len] = '\0';
    for (uVar6 = 0; read_len != uVar6; uVar6 = uVar6 + 1) {
      name_buf[uVar6] = ~name_buf[uVar6];
    }
    (*res_ifc->_vptr_CVmImageLoaderMres[2])
              (res_ifc,(ulong)(uint)(uVar2 + iVar4 + (int)lVar1),(ulong)(uint)uVar3,name_buf,
               read_len);
  }
  if (siz_local != 0) {
    (*this->fp_->_vptr_CVmImageFile[9])();
  }
  return;
}

Assistant:

void CVmImageLoader::load_mres(ulong siz, CVmImageLoaderMres *res_ifc)
{
    char buf[16];
    uint entry_cnt;
    long base_ofs;
    uint i;

    /* 
     *   Note the current physical seek position - each entry's seek position
     *   is stored in the table of contents as an offset from this location.
     *   
     *   Compute the physical base offset: this is the logical base offset in
     *   our image stream, plus the offset of the image stream within the
     *   image file.  We need the physical base offset because the underlying
     *   interpreter's resource loader works with the physical file, not the
     *   logical image stream.  
     */
    base_ofs = fp_->get_seek() + base_seek_ofs_;
    
    /* read the entry count and size of the table of contents */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        uint32_t entry_ofs;
        uint32_t entry_size;
        uint entry_name_len;
        char name_buf[256];
        char *p;
        size_t rem;

        /* read the fixed part of the table-of-contents entry */
        read_data(buf, 9, &siz);
        entry_ofs = t3rp4u(buf);
        entry_size = t3rp4u(buf + 4);
        entry_name_len = (uchar)*(buf + 8);

        /* read the name */
        read_data(name_buf, entry_name_len, &siz);

        /* null-terminate the name */
        name_buf[entry_name_len] = '\0';

        /* XOR the bytes of the name with 0xFF */
        for (p = name_buf, rem = entry_name_len ; rem != 0 ; ++p, --rem)
             *p ^= 0xFF;

        /* add the resource to the resource interface */
        res_ifc->add_resource(base_ofs + entry_ofs, entry_size,
                              name_buf, entry_name_len);
    }

    /* 
     *   skip the data portion of the block, since we now have a map of
     *   the data and can load individual resources on demand 
     */
    if (siz != 0)
        fp_->skip_ahead(siz);
}